

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

bool __thiscall
QGraphicsScenePrivate::filterDescendantEvent
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QEvent *event)

{
  bool bVar1;
  int iVar2;
  QGraphicsItem *this_00;
  bool bVar3;
  
  if ((item != (QGraphicsItem *)0x0) && ((((item->d_ptr).d)->field_0x162 & 8) != 0)) {
    this_00 = QGraphicsItem::parentItem(item);
    bVar3 = this_00 == (QGraphicsItem *)0x0;
    if (bVar3) {
      bVar1 = false;
    }
    else {
      do {
        if (((((this_00->d_ptr).d)->field_0x167 & 0x20) != 0) &&
           (iVar2 = (*this_00->_vptr_QGraphicsItem[0xc])(this_00,item,event), (char)iVar2 != '\0'))
        {
          bVar1 = true;
          goto LAB_00610154;
        }
        if ((((this_00->d_ptr).d)->field_0x162 & 8) == 0) {
          bVar1 = false;
          goto LAB_00610154;
        }
        this_00 = QGraphicsItem::parentItem(this_00);
        bVar3 = this_00 == (QGraphicsItem *)0x0;
      } while (!bVar3);
      bVar1 = false;
    }
LAB_00610154:
    if (!bVar3) {
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool QGraphicsScenePrivate::filterDescendantEvent(QGraphicsItem *item, QEvent *event)
{
    if (item && (item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorFiltersChildEvents)) {
        QGraphicsItem *parent = item->parentItem();
        while (parent) {
            if (parent->d_ptr->filtersDescendantEvents && parent->sceneEventFilter(item, event))
                return true;
            if (!(parent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorFiltersChildEvents))
                return false;
            parent = parent->parentItem();
        }
    }
    return false;
}